

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KokkosProfilingSymbols.cpp
# Opt level: O0

void kokkosp_begin_parallel_reduce(char *name,uint32_t devID,uint64_t *kID)

{
  uint64_t *local_20;
  uint64_t *kID_local;
  char *pcStack_10;
  uint32_t devID_local;
  char *name_local;
  
  local_20 = kID;
  kID_local._4_4_ = devID;
  pcStack_10 = name;
  cali::util::callback<void(char_const*,unsigned_int,unsigned_long*)>::operator()
            ((callback<void(char_const*,unsigned_int,unsigned_long*)> *)
             &kokkosp_callbacks.kokkosp_begin_parallel_reduce_callback,&stack0xfffffffffffffff0,
             (uint *)((long)&kID_local + 4),&local_20);
  return;
}

Assistant:

void kokkosp_begin_parallel_reduce(const char* name, const uint32_t devID, uint64_t* kID)
{
    kokkosp_callbacks.kokkosp_begin_parallel_reduce_callback(name, devID, kID);
}